

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O0

nodetree * FindChild(nodetree *p,tchar_t *Name)

{
  tchar_t *b;
  bool_t bVar1;
  nodetree *pnVar2;
  tchar_t *s;
  nodetree *Result;
  tchar_t *Name_local;
  nodetree *p_local;
  
  Name_local = (tchar_t *)p->Children;
  do {
    if (Name_local == (tchar_t *)0x0) {
      return (nodetree *)0x0;
    }
    b = (tchar_t *)Node_GetData((node *)Name_local,5,4);
    if (b == (tchar_t *)0x0) {
      if (Name_local == (tchar_t *)0x0) {
        __assert_fail("(const void*)(p)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                      ,0x93,"nodetree *FindChild(nodetree *, const tchar_t *)");
      }
      pnVar2 = (nodetree *)(**(code **)(*(long *)(Name_local + 8) + 0x68))(Name_local,Name);
      if (pnVar2 != (nodetree *)0x0) {
        return pnVar2;
      }
    }
    else {
      bVar1 = tcsisame_ascii(Name,b);
      if (bVar1 != 0) {
        return (nodetree *)Name_local;
      }
    }
    if (Name_local == *(tchar_t **)(Name_local + 0x28)) {
      __assert_fail("(nodetree*)(p) != ((nodetree*)(p))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                    ,0x8a,"nodetree *FindChild(nodetree *, const tchar_t *)");
    }
    Name_local = *(tchar_t **)(Name_local + 0x28);
  } while( true );
}

Assistant:

static nodetree* FindChild(nodetree* p, const tchar_t* Name)
{
    nodetree* Result;
    for (p=NodeTree_Children(p);p;p=NodeTree_Next(p))
    {
        const tchar_t* s = Node_GetData((node*)p,NODE_ID,TYPE_STRING);
        if (s)
        {
            if (tcsisame_ascii(Name,s))
                return p;
        }
        else
        if ((Result = NodeTree_FindChild(p,Name))!=NULL)
            return Result;
    }
    return NULL;
}